

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution.cpp
# Opt level: O3

int __thiscall ncnn::Deconvolution::load_model(Deconvolution *this,ModelBin *mb)

{
  int *piVar1;
  void *pvVar2;
  Allocator *pAVar3;
  int iVar4;
  void *local_60;
  int *local_58;
  size_t local_50;
  Allocator *local_48;
  int local_40;
  int iStack_3c;
  int iStack_38;
  int iStack_34;
  size_t local_30;
  
  (**mb->_vptr_ModelBin)(&local_60,mb,(ulong)(uint)this->weight_data_size,0);
  if (&this->weight_data != (Mat *)&local_60) {
    if (local_58 != (int *)0x0) {
      LOCK();
      *local_58 = *local_58 + 1;
      UNLOCK();
    }
    piVar1 = (this->weight_data).refcount;
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        pvVar2 = (this->weight_data).data;
        pAVar3 = (this->weight_data).allocator;
        if (pAVar3 == (Allocator *)0x0) {
          if (pvVar2 != (void *)0x0) {
            free(*(void **)((long)pvVar2 + -8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar3 + 8))();
        }
      }
    }
    (this->weight_data).data = local_60;
    (this->weight_data).refcount = local_58;
    (this->weight_data).elemsize = local_50;
    (this->weight_data).allocator = local_48;
    (this->weight_data).dims = local_40;
    (this->weight_data).w = iStack_3c;
    (this->weight_data).h = iStack_38;
    (this->weight_data).c = iStack_34;
    (this->weight_data).cstep = local_30;
  }
  if (local_58 != (int *)0x0) {
    LOCK();
    *local_58 = *local_58 + -1;
    UNLOCK();
    if (*local_58 == 0) {
      if (local_48 == (Allocator *)0x0) {
        if (local_60 != (void *)0x0) {
          free(*(void **)((long)local_60 + -8));
        }
      }
      else {
        (**(code **)(*(long *)local_48 + 8))();
      }
    }
  }
  iVar4 = -100;
  if (((this->weight_data).data != (void *)0x0) &&
     ((long)(this->weight_data).c * (this->weight_data).cstep != 0)) {
    if (this->bias_term != 0) {
      (**mb->_vptr_ModelBin)(&local_60,mb,(ulong)(uint)this->num_output,1);
      if (&this->bias_data != (Mat *)&local_60) {
        if (local_58 != (int *)0x0) {
          LOCK();
          *local_58 = *local_58 + 1;
          UNLOCK();
        }
        piVar1 = (this->bias_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            pvVar2 = (this->bias_data).data;
            pAVar3 = (this->bias_data).allocator;
            if (pAVar3 == (Allocator *)0x0) {
              if (pvVar2 != (void *)0x0) {
                free(*(void **)((long)pvVar2 + -8));
              }
            }
            else {
              (**(code **)(*(long *)pAVar3 + 8))();
            }
          }
        }
        (this->bias_data).data = local_60;
        (this->bias_data).refcount = local_58;
        (this->bias_data).elemsize = local_50;
        (this->bias_data).allocator = local_48;
        (this->bias_data).dims = local_40;
        (this->bias_data).w = iStack_3c;
        (this->bias_data).h = iStack_38;
        (this->bias_data).c = iStack_34;
        (this->bias_data).cstep = local_30;
      }
      if (local_58 != (int *)0x0) {
        LOCK();
        *local_58 = *local_58 + -1;
        UNLOCK();
        if (*local_58 == 0) {
          if (local_48 == (Allocator *)0x0) {
            if (local_60 != (void *)0x0) {
              free(*(void **)((long)local_60 + -8));
            }
          }
          else {
            (**(code **)(*(long *)local_48 + 8))();
          }
        }
      }
      if ((this->bias_data).data == (void *)0x0) {
        return -100;
      }
      if ((long)(this->bias_data).c * (this->bias_data).cstep == 0) {
        return -100;
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int Deconvolution::load_model(const ModelBin& mb)
{
    weight_data = mb.load(weight_data_size, 0);
    if (weight_data.empty())
        return -100;

    if (bias_term)
    {
        bias_data = mb.load(num_output, 1);
        if (bias_data.empty())
            return -100;
    }

    return 0;
}